

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O3

string * __thiscall
rest_rpc::rpc_service::router::get_name_by_key_abi_cxx11_
          (string *__return_storage_ptr__,router *this,uint32_t key)

{
  bool bVar1;
  uint __val;
  char cVar2;
  char cVar3;
  iterator iVar4;
  uint uVar5;
  string *__str;
  uint local_14;
  
  local_14 = key;
  iVar4 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->key2func_name_)._M_h,&local_14);
  __val = local_14;
  if (iVar4.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    cVar3 = '\x01';
    if (9 < local_14) {
      uVar5 = local_14;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar5 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0016f8a8;
        }
        if (uVar5 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0016f8a8;
        }
        if (uVar5 < 10000) goto LAB_0016f8a8;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_0016f8a8:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p,
               (uint)__return_storage_ptr__->_M_string_length,__val);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x10),
               *(long *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x18) +
               *(long *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_name_by_key(uint32_t key) {
    auto it = key2func_name_.find(key);
    if (it != key2func_name_.end()) {
      return it->second;
    }
    return std::to_string(key);
  }